

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bigint.h
# Opt level: O0

bool fast_float::small_mul<(unsigned_short)62>(stackvec<(unsigned_short)62> *vec,limb y)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [8];
  bool bVar5;
  size_t sVar6;
  limb *plVar7;
  ulong local_60;
  size_t index;
  limb carry;
  limb y_local;
  stackvec<(unsigned_short)62> *vec_local;
  undefined1 local_38 [8];
  __uint128_t z;
  size_t *local_20;
  limb local_18;
  ulong local_10;
  
  index = 0;
  carry = y;
  y_local = (limb)vec;
  for (local_60 = 0;
      sVar6 = stackvec<(unsigned_short)62>::len((stackvec<(unsigned_short)62> *)y_local),
      local_60 < sVar6; local_60 = local_60 + 1) {
    plVar7 = stackvec<(unsigned_short)62>::operator[]
                       ((stackvec<(unsigned_short)62> *)y_local,local_60);
    local_10 = *plVar7;
    local_18 = carry;
    local_20 = &index;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = local_10;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = carry;
    auVar3._8_8_ = 0;
    auVar3._0_8_ = index;
    _local_38 = auVar1 * auVar2 + auVar3;
    index = (size_t)z;
    auVar4 = local_38;
    plVar7 = stackvec<(unsigned_short)62>::operator[]
                       ((stackvec<(unsigned_short)62> *)y_local,local_60);
    *plVar7 = (limb)auVar4;
  }
  if ((index == 0) ||
     (bVar5 = stackvec<(unsigned_short)62>::try_push((stackvec<(unsigned_short)62> *)y_local,index),
     bVar5)) {
    vec_local._7_1_ = true;
  }
  else {
    vec_local._7_1_ = false;
  }
  return vec_local._7_1_;
}

Assistant:

inline FASTFLOAT_CONSTEXPR20
bool small_mul(stackvec<size>& vec, limb y) noexcept {
  limb carry = 0;
  for (size_t index = 0; index < vec.len(); index++) {
    vec[index] = scalar_mul(vec[index], y, carry);
  }
  if (carry != 0) {
    FASTFLOAT_TRY(vec.try_push(carry));
  }
  return true;
}